

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_itrans_recon_dc.c
# Opt level: O3

void ihevcd_itrans_recon_dc_chroma
               (UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 pred_strd,WORD32 dst_strd,
               WORD32 log2_trans_size,WORD16 i2_coeff_value)

{
  int iVar1;
  uint uVar2;
  WORD32 quant_out;
  undefined6 in_register_0000008a;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  if (log2_trans_size != 0x1f) {
    uVar3 = 1 << ((byte)log2_trans_size & 0x1f);
    iVar8 = 0;
    iVar5 = 0;
    uVar2 = 0;
    uVar7 = (ulong)uVar3;
    iVar4 = iVar8;
    iVar1 = iVar5;
    do {
      do {
        iVar6 = (uint)pu1_pred[iVar5] +
                (((int)CONCAT62(in_register_0000008a,i2_coeff_value) * 0x40 + 0x40 >> 1) + 0x800 >>
                0xc);
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        if (0xfe < iVar6) {
          iVar6 = 0xff;
        }
        pu1_dst[iVar8] = (UWORD8)iVar6;
        iVar5 = iVar5 + 2;
        iVar8 = iVar8 + 2;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      uVar2 = uVar2 + 1;
      iVar5 = iVar1 + pred_strd;
      iVar8 = iVar4 + dst_strd;
      uVar7 = (ulong)uVar3;
      iVar4 = iVar8;
      iVar1 = iVar5;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

void ihevcd_itrans_recon_dc_chroma(UWORD8 *pu1_pred,
                                   UWORD8 *pu1_dst,
                                   WORD32 pred_strd,
                                   WORD32 dst_strd,
                                   WORD32 log2_trans_size,
                                   WORD16 i2_coeff_value)
{
    WORD32 row, col;
    WORD32 add, shift;
    WORD32 dc_value, quant_out;
    WORD32 trans_size;


    trans_size = (1 << log2_trans_size);

    quant_out = i2_coeff_value;

    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((quant_out * 64 + add) >> shift);
    shift = IT_SHIFT_STAGE_2;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((dc_value * 64 + add) >> shift);

    for(row = 0; row < trans_size; row++)
        for(col = 0; col < trans_size; col++)
            pu1_dst[row * dst_strd + (col << 1)] = CLIP_U8((pu1_pred[row * pred_strd + (col << 1)] + dc_value));

}